

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

void printoption(SessionHandle *data,char *direction,int cmd,int option)

{
  char *pcVar1;
  char *pcVar2;
  
  if ((data->set).verbose != true) {
    return;
  }
  switch(cmd) {
  case 0xfb:
    pcVar1 = "WILL";
    break;
  case 0xfc:
    pcVar1 = "WONT";
    break;
  case 0xfd:
    pcVar1 = "DO";
    break;
  default:
    pcVar1 = "DONT";
    break;
  case 0xff:
    if (option - 0xecU < 0x14) {
      Curl_infof(data,"%s IAC %s\n",direction,telnetcmds[option - 0xecU]);
      return;
    }
    Curl_infof(data,"%s IAC %d\n",direction,(ulong)(uint)option);
    return;
  }
  if (option < 0x28) {
    pcVar2 = telnetoptions[option];
  }
  else {
    if (option != 0xff) {
      Curl_infof(data,"%s %s %d\n",direction,pcVar1);
      return;
    }
    pcVar2 = "EXOPL";
  }
  Curl_infof(data,"%s %s %s\n",direction,pcVar1,pcVar2);
  return;
}

Assistant:

static void printoption(struct SessionHandle *data,
                        const char *direction, int cmd, int option)
{
  const char *fmt;
  const char *opt;

  if(data->set.verbose) {
    if(cmd == CURL_IAC) {
      if(CURL_TELCMD_OK(option))
        infof(data, "%s IAC %s\n", direction, CURL_TELCMD(option));
      else
        infof(data, "%s IAC %d\n", direction, option);
    }
    else {
      fmt = (cmd == CURL_WILL) ? "WILL" : (cmd == CURL_WONT) ? "WONT" :
        (cmd == CURL_DO) ? "DO" : (cmd == CURL_DONT) ? "DONT" : 0;
      if(fmt) {
        if(CURL_TELOPT_OK(option))
          opt = CURL_TELOPT(option);
        else if(option == CURL_TELOPT_EXOPL)
          opt = "EXOPL";
        else
          opt = NULL;

        if(opt)
          infof(data, "%s %s %s\n", direction, fmt, opt);
        else
          infof(data, "%s %s %d\n", direction, fmt, option);
      }
      else
        infof(data, "%s %d %d\n", direction, cmd, option);
    }
  }
}